

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ec_asn1.cc
# Opt level: O3

EC_KEY * EC_KEY_parse_private_key(CBS *cbs,EC_GROUP *group)

{
  int iVar1;
  EC_GROUP *b;
  EC_KEY *key;
  BIGNUM *prv;
  EC_POINT *pEVar2;
  int iVar3;
  uint8_t padding;
  CBS ec_private_key;
  CBS child;
  CBS public_key;
  uint64_t version;
  CBS private_key;
  uint8_t local_61;
  CBS local_60;
  CBS local_50;
  CBS local_40;
  uint64_t local_30;
  CBS local_28;
  
  iVar1 = CBS_get_asn1(cbs,&local_60,0x20000010);
  if ((((iVar1 == 0) || (iVar1 = CBS_get_asn1_uint64(&local_60,&local_30), iVar1 == 0)) ||
      (local_30 != 1)) || (iVar1 = CBS_get_asn1(&local_60,&local_28,4), iVar1 == 0)) {
    iVar1 = 0x80;
    iVar3 = 0x35;
LAB_001b92f3:
    ERR_put_error(0xf,0,iVar1,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/ec/ec_asn1.cc"
                  ,iVar3);
    return (EC_KEY *)0x0;
  }
  iVar1 = CBS_peek_asn1_tag(&local_60,0xa0000000);
  if (iVar1 == 0) {
    if (group == (EC_GROUP *)0x0) {
      iVar1 = 0x72;
      iVar3 = 0x56;
      goto LAB_001b92f3;
    }
  }
  else {
    iVar1 = CBS_get_asn1(&local_60,&local_50,0xa0000000);
    if (iVar1 == 0) {
      iVar1 = 0x80;
      iVar3 = 0x41;
LAB_001b9490:
      ERR_put_error(0xf,0,iVar1,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/ec/ec_asn1.cc"
                    ,iVar3);
      return (EC_KEY *)0x0;
    }
    b = EC_KEY_parse_parameters(&local_50);
    if (b == (EC_GROUP *)0x0) {
      return (EC_KEY *)0x0;
    }
    if ((group != (EC_GROUP *)0x0) &&
       (iVar1 = EC_GROUP_cmp((EC_GROUP *)group,(EC_GROUP *)b,(BN_CTX *)0x0), b = group, iVar1 != 0))
    {
      iVar1 = 0x82;
      iVar3 = 0x4c;
      goto LAB_001b9490;
    }
    group = b;
    if (local_50.len != 0) {
      iVar1 = 0x80;
      iVar3 = 0x50;
      goto LAB_001b9490;
    }
  }
  key = (EC_KEY *)EC_KEY_new();
  if (key == (EC_KEY *)0x0) {
    return (EC_KEY *)0x0;
  }
  iVar1 = EC_KEY_set_group((EC_KEY *)key,(EC_GROUP *)group);
  if (iVar1 == 0) goto LAB_001b9500;
  prv = BN_bin2bn(local_28.data,(int)local_28.len,(BIGNUM *)0x0);
  pEVar2 = (EC_POINT *)EC_POINT_new((EC_GROUP *)group);
  key->pub_key = pEVar2;
  if (prv == (BIGNUM *)0x0) goto LAB_001b9500;
  if ((pEVar2 != (EC_POINT *)0x0) && (iVar1 = EC_KEY_set_private_key((EC_KEY *)key,prv), iVar1 != 0)
     ) {
    iVar1 = CBS_peek_asn1_tag(&local_60,0xa0000001);
    if (iVar1 == 0) {
      iVar1 = ec_point_mul_scalar_base(group,&key->pub_key->raw,&key->priv_key->scalar);
      if (iVar1 != 0) {
        *(byte *)&key->enc_flag = (byte)key->enc_flag | 2;
        goto LAB_001b94d2;
      }
    }
    else {
      iVar1 = CBS_get_asn1(&local_60,&local_50,0xa0000001);
      if (((((iVar1 == 0) || (iVar1 = CBS_get_asn1(&local_50,&local_40,3), iVar1 == 0)) ||
           (iVar1 = CBS_get_u8(&local_40,&local_61), iVar1 == 0)) ||
          ((local_61 != '\0' || (local_40.len == 0)))) ||
         ((iVar1 = EC_POINT_oct2point((EC_GROUP *)group,(EC_POINT *)key->pub_key,local_40.data,
                                      local_40.len,(BN_CTX *)0x0), iVar1 == 0 || (local_50.len != 0)
          ))) {
        iVar1 = 0x79;
      }
      else {
        key->conv_form = *local_40.data & 0xfffffffe;
LAB_001b94d2:
        if (local_60.len == 0) {
          iVar1 = EC_KEY_check_key((EC_KEY *)key);
          if (iVar1 != 0) {
            BN_free(prv);
            return key;
          }
          goto LAB_001b94f8;
        }
        iVar1 = 0x8d;
      }
      ERR_put_error(0xf,0,0x80,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/ec/ec_asn1.cc"
                    ,iVar1);
    }
  }
LAB_001b94f8:
  BN_free(prv);
LAB_001b9500:
  EC_KEY_free((EC_KEY *)key);
  return (EC_KEY *)0x0;
}

Assistant:

EC_KEY *EC_KEY_parse_private_key(CBS *cbs, const EC_GROUP *group) {
  CBS ec_private_key, private_key;
  uint64_t version;
  if (!CBS_get_asn1(cbs, &ec_private_key, CBS_ASN1_SEQUENCE) ||
      !CBS_get_asn1_uint64(&ec_private_key, &version) ||  //
      version != 1 ||
      !CBS_get_asn1(&ec_private_key, &private_key, CBS_ASN1_OCTETSTRING)) {
    OPENSSL_PUT_ERROR(EC, EC_R_DECODE_ERROR);
    return nullptr;
  }

  // Parse the optional parameters field.
  if (CBS_peek_asn1_tag(&ec_private_key, kParametersTag)) {
    // Per SEC 1, as an alternative to omitting it, one is allowed to specify
    // this field and put in a NULL to mean inheriting this value. This was
    // omitted in a previous version of this logic without problems, so leave it
    // unimplemented.
    CBS child;
    if (!CBS_get_asn1(&ec_private_key, &child, kParametersTag)) {
      OPENSSL_PUT_ERROR(EC, EC_R_DECODE_ERROR);
      return nullptr;
    }
    const EC_GROUP *inner_group = EC_KEY_parse_parameters(&child);
    if (inner_group == nullptr) {
      return nullptr;
    }
    if (group == nullptr) {
      group = inner_group;
    } else if (EC_GROUP_cmp(group, inner_group, nullptr) != 0) {
      // If a group was supplied externally, it must match.
      OPENSSL_PUT_ERROR(EC, EC_R_GROUP_MISMATCH);
      return nullptr;
    }
    if (CBS_len(&child) != 0) {
      OPENSSL_PUT_ERROR(EC, EC_R_DECODE_ERROR);
      return nullptr;
    }
  }

  if (group == nullptr) {
    OPENSSL_PUT_ERROR(EC, EC_R_MISSING_PARAMETERS);
    return nullptr;
  }

  bssl::UniquePtr<EC_KEY> ret(EC_KEY_new());
  if (ret == nullptr || !EC_KEY_set_group(ret.get(), group)) {
    return nullptr;
  }

  // Although RFC 5915 specifies the length of the key, OpenSSL historically
  // got this wrong, so accept any length. See upstream's
  // 30cd4ff294252c4b6a4b69cbef6a5b4117705d22.
  bssl::UniquePtr<BIGNUM> priv_key(
      BN_bin2bn(CBS_data(&private_key), CBS_len(&private_key), nullptr));
  ret->pub_key = EC_POINT_new(group);
  if (priv_key == nullptr || ret->pub_key == nullptr ||
      !EC_KEY_set_private_key(ret.get(), priv_key.get())) {
    return nullptr;
  }

  if (CBS_peek_asn1_tag(&ec_private_key, kPublicKeyTag)) {
    CBS child, public_key;
    uint8_t padding;
    if (!CBS_get_asn1(&ec_private_key, &child, kPublicKeyTag) ||
        !CBS_get_asn1(&child, &public_key, CBS_ASN1_BITSTRING) ||
        // As in a SubjectPublicKeyInfo, the byte-encoded public key is then
        // encoded as a BIT STRING with bits ordered as in the DER encoding.
        !CBS_get_u8(&public_key, &padding) ||  //
        padding != 0 ||
        // Explicitly check |public_key| is non-empty to save the conversion
        // form later.
        CBS_len(&public_key) == 0 ||
        !EC_POINT_oct2point(group, ret->pub_key, CBS_data(&public_key),
                            CBS_len(&public_key), nullptr) ||
        CBS_len(&child) != 0) {
      OPENSSL_PUT_ERROR(EC, EC_R_DECODE_ERROR);
      return nullptr;
    }

    // Save the point conversion form.
    // TODO(davidben): Consider removing this.
    ret->conv_form =
        (point_conversion_form_t)(CBS_data(&public_key)[0] & ~0x01);
  } else {
    // Compute the public key instead.
    if (!ec_point_mul_scalar_base(group, &ret->pub_key->raw,
                                  &ret->priv_key->scalar)) {
      return nullptr;
    }
    // Remember the original private-key-only encoding.
    // TODO(davidben): Consider removing this.
    ret->enc_flag |= EC_PKEY_NO_PUBKEY;
  }

  if (CBS_len(&ec_private_key) != 0) {
    OPENSSL_PUT_ERROR(EC, EC_R_DECODE_ERROR);
    return nullptr;
  }

  // Ensure the resulting key is valid.
  if (!EC_KEY_check_key(ret.get())) {
    return nullptr;
  }

  return ret.release();
}